

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O2

void __thiscall ezexample::~ezexample(ezexample *this)

{
  example **ppeVar1;
  example *ec;
  bool bVar2;
  example **ppeVar3;
  
  if (this->ec->in_use == true) {
    bVar2 = VW::is_ring_example(this->vw_par_ref,this->ec);
    if (bVar2) {
      VW::finish_example(this->vw_par_ref,this->ec);
    }
  }
  ppeVar1 = (this->example_copies)._end;
  for (ppeVar3 = (this->example_copies)._begin; ppeVar3 != ppeVar1; ppeVar3 = ppeVar3 + 1) {
    ec = *ppeVar3;
    if (ec->in_use == true) {
      bVar2 = VW::is_ring_example(this->vw_par_ref,this->ec);
      if (bVar2) {
        VW::finish_example(this->vw_par_ref,ec);
      }
    }
  }
  v_array<example_*>::clear(&this->example_copies);
  free((this->example_copies)._begin);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->past_seeds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

~ezexample()  // calls finish_example *only* if we created our own example!
  {
    if (ec->in_use && VW::is_ring_example(*vw_par_ref, ec))
      VW::finish_example(*vw_par_ref, *ec);
    for (auto ecc : example_copies)
      if (ecc->in_use && VW::is_ring_example(*vw_par_ref, ec))
        VW::finish_example(*vw_par_ref, *ecc);
    example_copies.clear();
    free(example_copies.begin());
  }